

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::B3DImporter::ReadKEYS(B3DImporter *this,aiNodeAnim *nodeAnim)

{
  uint uVar1;
  int iVar2;
  aiVectorKey *paVar3;
  aiQuatKey *paVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  aiQuaternion aVar6;
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> rot;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> scale;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> trans;
  aiQuatKey local_d0;
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> local_b8;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> local_98;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> local_78;
  undefined8 local_58;
  undefined8 local_48;
  
  local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVectorKey *)0x0;
  local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVectorKey *)0x0;
  local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVectorKey *)0x0;
  local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVectorKey *)0x0;
  local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (aiQuatKey *)0x0;
  local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.super__Vector_impl_data
  ._M_finish = (aiQuatKey *)0x0;
  uVar1 = ReadInt(this);
  if ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] != this->_pos) {
    do {
      iVar2 = ReadInt(this);
      if ((uVar1 & 1) != 0) {
        fVar5 = ReadFloat(this);
        local_48 = CONCAT44(extraout_XMM0_Db,fVar5);
        fVar5 = ReadFloat(this);
        local_58 = CONCAT44(extraout_XMM0_Db_00,fVar5);
        fVar5 = ReadFloat(this);
        local_d0.mTime = (double)iVar2;
        local_d0.mValue.y = fVar5;
        local_d0.mValue.w = (float)(undefined4)local_48;
        local_d0.mValue.x = (float)(undefined4)local_58;
        if (local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::_M_realloc_insert<aiVectorKey>
                    (&local_78,
                     (iterator)
                     local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                     super__Vector_impl_data._M_finish,(aiVectorKey *)&local_d0);
        }
        else {
          *(undefined8 *)
           &((local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
              super__Vector_impl_data._M_finish)->mValue).z = local_d0.mValue._8_8_;
          (local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
           super__Vector_impl_data._M_finish)->mTime = local_d0.mTime;
          ((local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
            super__Vector_impl_data._M_finish)->mValue).x = (float)(undefined4)local_48;
          ((local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
            super__Vector_impl_data._M_finish)->mValue).y = (float)(undefined4)local_58;
          local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((uVar1 & 2) != 0) {
        fVar5 = ReadFloat(this);
        local_48 = CONCAT44(extraout_XMM0_Db_01,fVar5);
        fVar5 = ReadFloat(this);
        local_58 = CONCAT44(extraout_XMM0_Db_02,fVar5);
        fVar5 = ReadFloat(this);
        local_d0.mTime = (double)iVar2;
        local_d0.mValue.y = fVar5;
        local_d0.mValue.w = (float)(undefined4)local_48;
        local_d0.mValue.x = (float)(undefined4)local_58;
        if (local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::_M_realloc_insert<aiVectorKey>
                    (&local_98,
                     (iterator)
                     local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                     super__Vector_impl_data._M_finish,(aiVectorKey *)&local_d0);
        }
        else {
          *(undefined8 *)
           &((local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
              super__Vector_impl_data._M_finish)->mValue).z = local_d0.mValue._8_8_;
          (local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
           super__Vector_impl_data._M_finish)->mTime = local_d0.mTime;
          ((local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
            super__Vector_impl_data._M_finish)->mValue).x = (float)(undefined4)local_48;
          ((local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
            super__Vector_impl_data._M_finish)->mValue).y = (float)(undefined4)local_58;
          local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((uVar1 & 4) != 0) {
        aVar6 = ReadQuat(this);
        local_d0.mTime = (double)iVar2;
        local_d0.mValue = aVar6;
        if (local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::_M_realloc_insert<aiQuatKey>
                    (&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_d0);
        }
        else {
          local_d0.mValue._8_8_ = aVar6._8_8_;
          ((local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
            super__Vector_impl_data._M_finish)->mValue).y = local_d0.mValue.y;
          ((local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
            super__Vector_impl_data._M_finish)->mValue).z = local_d0.mValue.z;
          local_d0.mValue._0_8_ = aVar6._0_8_;
          (local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
           super__Vector_impl_data._M_finish)->mTime = local_d0.mTime;
          ((local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
            super__Vector_impl_data._M_finish)->mValue).w = local_d0.mValue.w;
          ((local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
            super__Vector_impl_data._M_finish)->mValue).x = local_d0.mValue.x;
          local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
    } while ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1] != this->_pos);
  }
  if ((uVar1 & 1) != 0) {
    nodeAnim->mNumPositionKeys =
         (int)((ulong)((long)local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    paVar3 = to_array<aiVectorKey>(this,&local_78);
    nodeAnim->mPositionKeys = paVar3;
  }
  if ((uVar1 & 2) != 0) {
    nodeAnim->mNumScalingKeys =
         (int)((ulong)((long)local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    paVar3 = to_array<aiVectorKey>(this,&local_98);
    nodeAnim->mScalingKeys = paVar3;
  }
  if ((uVar1 & 4) != 0) {
    nodeAnim->mNumRotationKeys =
         (int)((ulong)((long)local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    paVar4 = to_array<aiQuatKey>(this,&local_b8);
    nodeAnim->mRotationKeys = paVar4;
  }
  if (local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void B3DImporter::ReadKEYS( aiNodeAnim *nodeAnim ){
    vector<aiVectorKey> trans,scale;
    vector<aiQuatKey> rot;
    int flags=ReadInt();
    while( ChunkSize() ){
        int frame=ReadInt();
        if( flags & 1 ){
            trans.push_back( aiVectorKey( frame,ReadVec3() ) );
        }
        if( flags & 2 ){
            scale.push_back( aiVectorKey( frame,ReadVec3() ) );
        }
        if( flags & 4 ){
            rot.push_back( aiQuatKey( frame,ReadQuat() ) );
        }
    }

    if( flags & 1 ){
        nodeAnim->mNumPositionKeys=static_cast<unsigned int>(trans.size());
        nodeAnim->mPositionKeys=to_array( trans );
    }

    if( flags & 2 ){
        nodeAnim->mNumScalingKeys=static_cast<unsigned int>(scale.size());
        nodeAnim->mScalingKeys=to_array( scale );
    }

    if( flags & 4 ){
        nodeAnim->mNumRotationKeys=static_cast<unsigned int>(rot.size());
        nodeAnim->mRotationKeys=to_array( rot );
    }
}